

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void ar(double *inp,int N,int p,int method,double *phi,double *var)

{
  double *resid;
  double local_50;
  double wmean;
  double loglik;
  double *local_38;
  
  if (method == 2) {
    loglik = (double)(long)N;
    resid = (double *)malloc((long)loglik * 8);
    local_38 = (double *)malloc((long)(p + 1) * (long)(p + 1) * 8);
    as154(inp,SUB84(loglik,0),7,p,0,0,phi,(double *)0x0,&local_50,var,resid,&wmean,local_38,0);
    free(resid);
    free(local_38);
    return;
  }
  if (method != 1) {
    if (method == 0) {
      ywalg2(inp,N,p,phi,var);
      return;
    }
    printf("The program only accepts 0,1 and 2 as input values for method");
    return;
  }
  burgalg(inp,N + -1,p,phi,var);
  return;
}

Assistant:

void ar(double *inp, int N, int p,int method,double *phi,double *var) {
	/*
	Method 0 : Yule Walker
	Method 1 : Burg
	Method 2 : MLE
	*/

	double wmean,loglik;
	double *resid,*hess;
	int cssml = 0;

	if (method == 0) {
		ywalg2(inp, N, p, phi,var);
	}
	else if (method == 1) {
		burgalg(inp, N - 1, p, phi, var);
	}
	else if (method == 2) {
		resid = (double*)malloc(sizeof(double)* N);
		hess = (double*)malloc(sizeof(double)* (p+1) * (p+1));
		as154(inp,N,7,p,0,0,phi,NULL, &wmean, var, resid, &loglik,hess,cssml);
		free(resid);
		free(hess);
	}
	else {
		printf("The program only accepts 0,1 and 2 as input values for method");
	}

}